

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadContents(ColladaParser *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  Logger *pLVar4;
  undefined4 extraout_var_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_00;
  basic_formatter *this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiString>_>,_bool>
  pVar5;
  char *local_5d8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  string local_458;
  _Base_ptr local_438;
  undefined1 local_430;
  undefined1 local_424 [8];
  aiString v;
  char *version;
  int attrib;
  ColladaParser *this_local;
  
  while (uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (uVar2 & 1) != 0) {
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    if (iVar3 == 1) {
      bVar1 = IsElement(this,"COLLADA");
      if (bVar1) {
        uVar2 = TestAttribute(this,"version");
        if (uVar2 != 0xffffffff) {
          v.data._1016_4_ = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar2);
          v.data._1020_4_ = extraout_var;
          aiString::aiString((aiString *)local_424);
          aiString::Set((aiString *)local_424,(char *)v.data._1016_8_);
          pVar5 = std::
                  map<std::__cxx11::string,aiString,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
                  ::emplace<char_const(&)[26],aiString&>
                            ((map<std::__cxx11::string,aiString,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
                              *)&this->mAssetMetaData,(char (*) [26])"SourceAsset_FormatVersion",
                             (aiString *)local_424);
          local_438 = (_Base_ptr)pVar5.first._M_node;
          local_430 = pVar5.second;
          iVar3 = strncmp((char *)v.data._1016_8_,"1.5",3);
          if (iVar3 == 0) {
            this->mFormat = FV_1_5_n;
            pLVar4 = DefaultLogger::get();
            Logger::debug(pLVar4,"Collada schema version is 1.5.n");
          }
          else {
            iVar3 = strncmp((char *)v.data._1016_8_,"1.4",3);
            if (iVar3 == 0) {
              this->mFormat = FV_1_4_n;
              pLVar4 = DefaultLogger::get();
              Logger::debug(pLVar4,"Collada schema version is 1.4.n");
            }
            else {
              iVar3 = strncmp((char *)v.data._1016_8_,"1.3",3);
              if (iVar3 == 0) {
                this->mFormat = FV_1_3_n;
                pLVar4 = DefaultLogger::get();
                Logger::debug(pLVar4,"Collada schema version is 1.3.n");
              }
            }
          }
        }
        ReadStructure(this);
      }
      else {
        pLVar4 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[26]>(&local_5d0,(char (*) [26])"Ignoring global element <");
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        local_5d8 = (char *)CONCAT44(extraout_var_00,iVar3);
        this_00 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &local_5d0,&local_5d8);
        this_01 = (basic_formatter *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(this_00,(char (*) [3])0xbb244a);
        Formatter::basic_formatter::operator_cast_to_string(&local_458,this_01);
        Logger::debug(pLVar4,&local_458);
        std::__cxx11::string::~string((string *)&local_458);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_5d0);
        SkipElement(this);
      }
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadContents()
{
    while (mReader->read())
    {
        // handle the root element "COLLADA"
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("COLLADA"))
            {
                // check for 'version' attribute
                const int attrib = TestAttribute("version");
                if (attrib != -1) {
                    const char* version = mReader->getAttributeValue(attrib);

                    // Store declared format version string
                    aiString v;
                    v.Set(version);
                    mAssetMetaData.emplace(AI_METADATA_SOURCE_FORMAT_VERSION, v );

                    if (!::strncmp(version, "1.5", 3)) {
                        mFormat = FV_1_5_n;
                        ASSIMP_LOG_DEBUG("Collada schema version is 1.5.n");
                    }
                    else if (!::strncmp(version, "1.4", 3)) {
                        mFormat = FV_1_4_n;
                        ASSIMP_LOG_DEBUG("Collada schema version is 1.4.n");
                    }
                    else if (!::strncmp(version, "1.3", 3)) {
                        mFormat = FV_1_3_n;
                        ASSIMP_LOG_DEBUG("Collada schema version is 1.3.n");
                    }
                }

                ReadStructure();
            }
            else
            {
                ASSIMP_LOG_DEBUG_F("Ignoring global element <", mReader->getNodeName(), ">.");
                SkipElement();
            }
        }
        else
        {
            // skip everything else silently
        }
    }
}